

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O2

void dmrC_insert_branch(dmr_C *C,basic_block *bb,instruction *jmp,basic_block *target)

{
  uint *puVar1;
  instruction *piVar2;
  basic_block *pbVar3;
  undefined1 local_58 [8];
  ptr_list_iter childiter__;
  
  piVar2 = (instruction *)ptrlist_undo_last((ptr_list **)&bb->insns);
  if (piVar2 == jmp) {
    dmrC_kill_instruction(C,piVar2);
    piVar2 = alloc_instruction(C,3,0);
    piVar2->bb = bb;
    (piVar2->field_6).field_1.bb_true = target;
    childiter__._16_8_ = C;
    ptrlist_add((ptr_list **)&bb->insns,piVar2,&C->ptrlist_allocator);
    ptrlist_forward_iterator((ptr_list_iter *)local_58,(ptr_list *)bb->children);
    pbVar3 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_58);
    while (pbVar3 != (basic_block *)0x0) {
      if (pbVar3 == target) {
        target = (basic_block *)0x0;
      }
      else {
        ptrlist_iter_remove((ptr_list_iter *)local_58);
        ptrlist_remove((ptr_list **)&pbVar3->parents,bb,1);
        if (pbVar3->parents == (basic_block_list *)0x0) {
          puVar1 = (uint *)(*(long *)(childiter__._16_8_ + 0x20) + 0x240);
          *puVar1 = *puVar1 | 3;
        }
      }
      pbVar3 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_58);
    }
    ptrlist_pack((ptr_list **)&bb->children);
    return;
  }
  __assert_fail("old == jmp",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                ,0x2bf,
                "void dmrC_insert_branch(struct dmr_C *, struct basic_block *, struct instruction *, struct basic_block *)"
               );
}

Assistant:

void dmrC_insert_branch(struct dmr_C *C, struct basic_block *bb, struct instruction *jmp, struct basic_block *target)
{
	struct instruction *br, *old;
	struct basic_block *child;

	/* Remove the switch */
	old = dmrC_delete_last_instruction(&bb->insns);
	assert(old == jmp);
	dmrC_kill_instruction(C, old);

	br = alloc_instruction(C, OP_BR, 0);
	br->bb = bb;
	br->bb_true = target;
	dmrC_add_instruction(C, &bb->insns, br);

	FOR_EACH_PTR(bb->children, child) {
		if (child == target) {
			target = NULL;	/* Trigger just once */
			continue;
		}
		DELETE_CURRENT_PTR(child);
		remove_parent(C, child, bb);
	} END_FOR_EACH_PTR(child);
	ptrlist_pack((struct ptr_list **)&bb->children);
}